

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileURL.cpp
# Opt level: O3

void __thiscall FileURL::SetURLFromString(FileURL *this,string *inURL)

{
  StringList *this_00;
  size_t *psVar1;
  int iVar2;
  long lVar3;
  _Node *p_Var4;
  ulong uVar5;
  string newComponent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = &this->mPathComponents;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  (this->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->mIsAbsolute = false;
  if (8 < inURL->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)inURL);
    iVar2 = std::__cxx11::string::compare((char *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (iVar2 == 0) {
      this->mIsAbsolute = true;
      uVar5 = 8;
      goto LAB_00191c68;
    }
  }
  uVar5 = 0;
LAB_00191c68:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (uVar5 < inURL->_M_string_length) {
    do {
      lVar3 = std::__cxx11::string::find((char *)inURL,0x2e32fe,uVar5);
      if (lVar3 == -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)inURL);
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)inURL);
      }
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_70);
      if ((iVar2 == 0) &&
         ((this->mPathComponents).
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size != 0)) {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((this->mPathComponents).
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev + 1));
        if (iVar2 == 0) goto LAB_00191d4e;
        if ((this->mPathComponents).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size != 0) {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(this_00,(this->mPathComponents).
                             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev);
        }
      }
      else {
LAB_00191d4e:
        iVar2 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar2 != 0) {
          p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                   _M_create_node<std::__cxx11::string_const&>
                             ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              this_00,&local_70);
          std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
          psVar1 = &(this->mPathComponents).
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
      }
      uVar5 = lVar3 + 1U;
      if (lVar3 + 1U == 0) {
        uVar5 = inURL->_M_string_length;
      }
    } while (uVar5 < inURL->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void FileURL::SetURLFromString(const string& inURL)
{
	// path is expected to be either file:/ / /<folder1>/<folder2>....
	// or <folder1>/<folder2>...
    
	mPathComponents.clear();
	mIsAbsolute = false;	 
    
	string::size_type searchPosition = 0;
    
	if(inURL.size() > 8 && (inURL.substr(0,8) == "file:///"))
	{
        mIsAbsolute = true;
		searchPosition = 8; 
	}
    
	string newComponent;
	while(searchPosition < inURL.length())
	{
		string::size_type findResult = inURL.find("/",searchPosition);
		if(findResult == inURL.npos)
			newComponent = inURL.substr(searchPosition,findResult);
		else
			newComponent = inURL.substr(searchPosition,findResult-searchPosition);
        
		// with .. i'm doing some calculation already of sparing interim folders.
		// as a result if there are still ..s they will be only at the beginning of the path
		if(newComponent == ".." && mPathComponents.size() > 0 && mPathComponents.back() != "..")
			PopPathComponent();
		else if(newComponent != ".")
			PushPathComponent(newComponent);
        
		searchPosition = (findResult == inURL.npos) ? inURL.length() : findResult+1;
	}
}